

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int ddSymmSiftingConvAux(DdManager *table,int x,int xLow,int xHigh)

{
  uint uVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  Move *pMVar4;
  int iVar5;
  int iVar6;
  int finalGroupSize;
  int initGroupSize;
  int i;
  int result;
  int initialSize;
  Move *moveDown;
  Move *moveUp;
  Move *move;
  int xHigh_local;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  iVar5 = table->keys - table->isolated;
  _result = (DdNode *)0x0;
  moveDown = (Move *)0x0;
  if (x == xLow) {
    uVar1 = table->subtables[x].next;
    _result = (DdNode *)ddSymmSiftingDown(table,x,xHigh);
    if (_result == (DdNode *)0x1) goto LAB_00c20461;
    if (_result == (DdNode *)0x0) {
      return 1;
    }
    DVar2 = _result->ref;
    for (finalGroupSize = DVar2; (uint)finalGroupSize < table->subtables[finalGroupSize].next;
        finalGroupSize = table->subtables[finalGroupSize].next) {
    }
    if ((x - uVar1) + 1 == (finalGroupSize - DVar2) + 1) {
      iVar5 = ddSymmSiftingBackward(table,(Move *)_result,iVar5);
    }
    else {
      uVar1 = table->keys;
      iVar5 = table->isolated;
      moveDown = ddSymmSiftingUp(table,DVar2,xLow);
      iVar5 = ddSymmSiftingBackward(table,moveDown,uVar1 - iVar5);
    }
  }
  else {
    iVar6 = cuddNextHigh(table,x);
    xHigh_local = x;
    if (xHigh < iVar6) {
      for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
          xHigh_local = table->subtables[xHigh_local].next) {
      }
      uVar1 = table->subtables[xHigh_local].next;
      if (uVar1 == xLow) {
        return 1;
      }
      moveDown = ddSymmSiftingUp(table,uVar1,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c20461;
      if (moveDown == (Move *)0x0) {
        return 1;
      }
      DVar2 = moveDown->x;
      if ((xHigh_local - uVar1) + 1 == (DVar2 - table->subtables[(int)DVar2].next) + 1) {
        iVar5 = ddSymmSiftingBackward(table,moveDown,iVar5);
      }
      else {
        uVar1 = table->keys;
        iVar5 = table->isolated;
        _result = (DdNode *)ddSymmSiftingDown(table,DVar2,xHigh);
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,uVar1 - iVar5);
      }
    }
    else if (xHigh - x < x - xLow) {
      _result = (DdNode *)ddSymmSiftingDown(table,x,xHigh);
      if (_result == (DdNode *)0x1) goto LAB_00c20461;
      if (_result == (DdNode *)0x0) {
        for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
            xHigh_local = table->subtables[xHigh_local].next) {
        }
        finalGroupSize = xHigh_local;
        xHigh_local = table->subtables[xHigh_local].next;
      }
      else {
        xHigh_local = _result->ref;
        for (finalGroupSize = xHigh_local;
            (uint)finalGroupSize < table->subtables[finalGroupSize].next;
            finalGroupSize = table->subtables[finalGroupSize].next) {
        }
      }
      iVar6 = finalGroupSize - xHigh_local;
      moveDown = ddSymmSiftingUp(table,xHigh_local,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c20461;
      if (moveDown == (Move *)0x0) {
        finalGroupSize = xHigh_local;
        for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
            xHigh_local = table->subtables[xHigh_local].next) {
        }
      }
      else {
        xHigh_local = moveDown->x;
        finalGroupSize = table->subtables[xHigh_local].next;
      }
      if (iVar6 + 1 == (xHigh_local - finalGroupSize) + 1) {
        iVar5 = ddSymmSiftingBackward(table,moveDown,iVar5);
      }
      else {
        while (_result != (DdNode *)0x0) {
          pDVar3 = (_result->type).kids.T;
          _result->ref = 0;
          _result->next = table->nextFree;
          table->nextFree = _result;
          _result = pDVar3;
        }
        uVar1 = table->keys;
        iVar5 = table->isolated;
        _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,uVar1 - iVar5);
      }
    }
    else {
      finalGroupSize = table->subtables[x].next;
      moveDown = ddSymmSiftingUp(table,finalGroupSize,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c20461;
      xHigh_local = finalGroupSize;
      if (moveDown == (Move *)0x0) {
        for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
            xHigh_local = table->subtables[xHigh_local].next) {
        }
      }
      else {
        xHigh_local = moveDown->x;
        finalGroupSize = table->subtables[xHigh_local].next;
      }
      iVar6 = xHigh_local - finalGroupSize;
      _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
      if (_result == (DdNode *)0x1) goto LAB_00c20461;
      if (_result == (DdNode *)0x0) {
        finalGroupSize = xHigh_local;
        xHigh_local = table->subtables[xHigh_local].next;
      }
      else {
        xHigh_local = _result->ref;
        for (finalGroupSize = xHigh_local;
            (uint)finalGroupSize < table->subtables[finalGroupSize].next;
            finalGroupSize = table->subtables[finalGroupSize].next) {
        }
      }
      if (iVar6 + 1 == (finalGroupSize - xHigh_local) + 1) {
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,iVar5);
      }
      else {
        while (moveDown != (Move *)0x0) {
          pMVar4 = moveDown->next;
          moveDown->y = 0;
          *(DdNode **)&moveDown->flags = table->nextFree;
          table->nextFree = (DdNode *)moveDown;
          moveDown = pMVar4;
        }
        uVar1 = table->keys;
        iVar5 = table->isolated;
        moveDown = ddSymmSiftingUp(table,xHigh_local,xLow);
        iVar5 = ddSymmSiftingBackward(table,moveDown,uVar1 - iVar5);
      }
    }
  }
  if (iVar5 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
    while (moveDown != (Move *)0x0) {
      pMVar4 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar4;
    }
    return 1;
  }
LAB_00c20461:
  if (_result != (DdNode *)0x1) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
  }
  if (moveDown != (Move *)0x1) {
    while (moveDown != (Move *)0x0) {
      pMVar4 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar4;
    }
  }
  return 0;
}

Assistant:

static int
ddSymmSiftingConvAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh)
{
    Move *move;
    Move *moveUp;       /* list of up moves */
    Move *moveDown;     /* list of down moves */
    int  initialSize;
    int  result;
    int  i;
    int  initGroupSize, finalGroupSize;


    initialSize = table->keys - table->isolated;

    moveDown = NULL;
    moveUp = NULL;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x is bottom of symmetry group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        i = table->subtables[x].next;
        initGroupSize = x - i + 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        /* at this point x == xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;
        if (moveDown == NULL) return(1);

        x = moveDown->y;
        i = x;
        while ((unsigned) i < table->subtables[i].next) {
            i = table->subtables[i].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetric group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetries detected, go back to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingConvAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
        /* Find top of x's symm group */
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
        i = x;                          /* bottom */
        x = table->subtables[x].next;   /* top */

        if (x == xLow) return(1);

        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
            /* at this point x == xLow, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;
        if (moveUp == NULL) return(1);

        x = moveUp->x;
        i = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result)
            goto ddSymmSiftingConvAuxOutOfMem;

    } else if ((x - xLow) > (xHigh - x)) { /* must go down first: shorter */
        moveDown = ddSymmSiftingDown(table,x,xHigh);
            /* at this point x == xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            i = x;
            x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        if (moveUp == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            i = x;
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            while (moveDown != NULL) {
                move = moveDown->next;
                cuddDeallocMove(table, moveDown);
                moveDown = move;
            }
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result) goto ddSymmSiftingConvAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's symmetry group */
        x = table->subtables[x].next;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        /* at this point x == xHigh, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            i = x;
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x is bottom of the symmetry group and i is top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        initGroupSize = x - i + 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        if (moveDown == MV_OOM) goto ddSymmSiftingConvAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            i = x;
            x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetries detected, go back to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            while (moveUp != NULL) {
                move = moveUp->next;
                cuddDeallocMove(table, moveUp);
                moveUp = move;
            }
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingConvAuxOutOfMem;
    }

    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(1);

ddSymmSiftingConvAuxOutOfMem:
    if (moveDown != MV_OOM) {
        while (moveDown != NULL) {
            move = moveDown->next;
            cuddDeallocMove(table, moveDown);
            moveDown = move;
        }
    }
    if (moveUp != MV_OOM) {
        while (moveUp != NULL) {
            move = moveUp->next;
            cuddDeallocMove(table, moveUp);
            moveUp = move;
        }
    }

    return(0);

}